

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_render_batch *
rf_create_custom_render_batch
          (rf_render_batch *__return_storage_ptr__,rf_int vertex_buffers_count,
          rf_int draw_calls_count,rf_int vertex_buffer_elements_count,rf_allocator allocator)

{
  rf_render_batch local_110;
  rf_gfx_vertex_data_type *local_d8;
  char *this_buffer_memory;
  rf_int indices_size;
  rf_int colors_size;
  rf_int texcoords_size;
  rf_int vertices_size;
  rf_int one_vertex_buffer_memory_size;
  rf_int i;
  char *buffers_memory;
  rf_draw_call *draw_calls;
  rf_vertex_buffer *buffers;
  char *local_80;
  undefined4 local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  rf_vertex_buffer *local_58;
  char *memory;
  rf_int allocation_size;
  rf_int draw_calls_array_size;
  rf_int vertex_buffers_memory_size;
  rf_int vertex_buffer_array_size;
  rf_int vertex_buffer_elements_count_local;
  rf_int draw_calls_count_local;
  rf_int vertex_buffers_count_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  vertex_buffers_count_local = (rf_int)allocator.user_data;
  vertex_buffer_array_size = vertex_buffer_elements_count;
  vertex_buffer_elements_count_local = draw_calls_count;
  draw_calls_count_local = vertex_buffers_count;
  if (((vertex_buffers_count < 0) || (draw_calls_count < 0)) || (vertex_buffer_elements_count < 0))
  {
    memset(__return_storage_ptr__,0,0x38);
  }
  else {
    memset(__return_storage_ptr__,0,0x38);
    vertex_buffers_memory_size = draw_calls_count_local * 0x48;
    draw_calls_array_size = vertex_buffer_array_size * 0x78 * draw_calls_count_local;
    allocation_size = vertex_buffer_elements_count_local * 0x10;
    local_80 = (char *)(vertex_buffers_memory_size + allocation_size + draw_calls_array_size);
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_68 = "rf_create_custom_render_batch";
    local_60 = 0x5e1e;
    buffers = (rf_vertex_buffer *)0x0;
    local_78 = 0;
    memory = local_80;
    draw_calls = (rf_draw_call *)(*(code *)allocator_local.user_data)(&vertex_buffers_count_local,1)
    ;
    if ((rf_vertex_buffer *)draw_calls != (rf_vertex_buffer *)0x0) {
      buffers_memory =
           (char *)((long)((rf_vertex_buffer *)draw_calls)->vbo_id +
                   vertex_buffers_memory_size + -0x14);
      i = (long)((rf_vertex_buffer *)draw_calls)->vbo_id +
          allocation_size + vertex_buffers_memory_size + -0x14;
      for (one_vertex_buffer_memory_size = 0; one_vertex_buffer_memory_size < draw_calls_count_local
          ; one_vertex_buffer_memory_size = one_vertex_buffer_memory_size + 1) {
        vertices_size = vertex_buffer_array_size * 0x78;
        texcoords_size = vertex_buffer_array_size * 4;
        colors_size = vertex_buffer_array_size * 4;
        indices_size = vertex_buffer_array_size;
        this_buffer_memory = (char *)(vertex_buffer_array_size << 2);
        local_d8 = (rf_gfx_vertex_data_type *)(i + vertices_size * one_vertex_buffer_memory_size);
        ((rf_vertex_buffer *)((long)draw_calls + one_vertex_buffer_memory_size * 0x48))->
        elements_count = (int)vertex_buffer_array_size;
        ((rf_vertex_buffer *)((long)draw_calls + one_vertex_buffer_memory_size * 0x48))->vertices =
             local_d8;
        ((rf_vertex_buffer *)((long)draw_calls + one_vertex_buffer_memory_size * 0x48))->texcoords =
             local_d8 + vertex_buffer_array_size * 4;
        ((rf_vertex_buffer *)((long)draw_calls + one_vertex_buffer_memory_size * 0x48))->colors =
             (rf_gfx_color_data_type *)(local_d8 + vertex_buffer_array_size * 2);
        ((rf_vertex_buffer *)((long)draw_calls + one_vertex_buffer_memory_size * 0x48))->indices =
             (rf_gfx_vertex_index_data_type *)(local_d8 + vertex_buffer_array_size * 9);
      }
      local_58 = (rf_vertex_buffer *)draw_calls;
      rf_create_custom_render_batch_from_buffers
                (&local_110,(rf_vertex_buffer *)draw_calls,draw_calls_count_local,
                 (rf_draw_call *)buffers_memory,vertex_buffer_elements_count_local);
      memcpy(__return_storage_ptr__,&local_110,0x38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_render_batch rf_create_custom_render_batch(rf_int vertex_buffers_count, rf_int draw_calls_count, rf_int vertex_buffer_elements_count, rf_allocator allocator)
{
    if (vertex_buffers_count < 0 || draw_calls_count < 0 || vertex_buffer_elements_count < 0) {
        return (rf_render_batch) {0};
    }

    rf_render_batch result = {0};

    rf_int vertex_buffer_array_size = sizeof(rf_vertex_buffer) * vertex_buffers_count;
    rf_int vertex_buffers_memory_size = (sizeof(rf_one_element_vertex_buffer) * vertex_buffer_elements_count) * vertex_buffers_count;
    rf_int draw_calls_array_size = sizeof(rf_draw_call) * draw_calls_count;
    rf_int allocation_size = vertex_buffer_array_size + draw_calls_array_size + vertex_buffers_memory_size;

    char* memory = RF_ALLOC(allocator, allocation_size);

    if (memory)
    {
        rf_vertex_buffer* buffers = (rf_vertex_buffer*) memory;
        rf_draw_call* draw_calls = (rf_draw_call*) (memory + vertex_buffer_array_size);
        char* buffers_memory = memory + vertex_buffer_array_size + draw_calls_array_size;

        RF_ASSERT(((char*)draw_calls - memory) == draw_calls_array_size + vertex_buffers_memory_size);
        RF_ASSERT((buffers_memory - memory) == vertex_buffers_memory_size);
        RF_ASSERT((buffers_memory - memory) == sizeof(rf_one_element_vertex_buffer) * vertex_buffer_elements_count * vertex_buffers_count);

        for (rf_int i = 0; i < vertex_buffers_count; i++)
        {
            rf_int one_vertex_buffer_memory_size = sizeof(rf_one_element_vertex_buffer) * vertex_buffer_elements_count;
            rf_int vertices_size = sizeof(rf_gfx_vertex_data_type) * vertex_buffer_elements_count;
            rf_int texcoords_size = sizeof(rf_gfx_texcoord_data_type) * vertex_buffer_elements_count;
            rf_int colors_size = sizeof(rf_gfx_color_data_type) * vertex_buffer_elements_count;
            rf_int indices_size = sizeof(rf_gfx_vertex_index_data_type) * vertex_buffer_elements_count;

            char* this_buffer_memory = buffers_memory + one_vertex_buffer_memory_size * i;

            buffers[i].elements_count = vertex_buffer_elements_count;
            buffers[i].vertices       = (rf_gfx_vertex_data_type*)       this_buffer_memory;
            buffers[i].texcoords      = (rf_gfx_texcoord_data_type*)     this_buffer_memory + vertices_size;
            buffers[i].colors         = (rf_gfx_color_data_type*)        this_buffer_memory + vertices_size + texcoords_size;
            buffers[i].indices        = (rf_gfx_vertex_index_data_type*) this_buffer_memory + vertices_size + texcoords_size + colors_size;
        }

        result = rf_create_custom_render_batch_from_buffers(buffers, vertex_buffers_count, draw_calls, draw_calls_count);
    }

    return result;
}